

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::ConfidentialTransactionController::GetSizeIgnoreTxIn
          (ConfidentialTransactionController *this,bool is_blinded,uint32_t *witness_area_size,
          uint32_t *no_witness_area_size,int exponent,int minimum_bits)

{
  bool bVar1;
  uint32_t uVar2;
  reference pCVar3;
  int *in_RCX;
  int *in_RDX;
  byte in_SIL;
  int in_R8D;
  uint in_R9D;
  ConfidentialTxOutReference *txout;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  *__range1_1;
  uint32_t temp_no_witness_size;
  uint32_t temp_witness_size;
  uint32_t no_witness_size;
  uint32_t witness_size;
  ConfidentialTxInReference *txin;
  iterator __end1;
  iterator __begin1;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  *__range1;
  uint32_t temp_asset_count;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  txins;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  uint32_t size;
  ConfidentialTxInReference *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  byte in_stack_ffffffffffffff04;
  byte in_stack_ffffffffffffff05;
  byte in_stack_ffffffffffffff06;
  byte in_stack_ffffffffffffff07;
  __normal_iterator<cfd::core::ConfidentialTxOutReference_*,_std::vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>_>
  local_e0;
  undefined1 *local_d8;
  int local_d0;
  uint local_cc;
  int local_c8;
  int local_c4;
  reference local_90;
  ConfidentialTxInReference *local_88;
  __normal_iterator<cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
  local_80;
  undefined1 *local_78;
  int local_70;
  undefined1 local_60 [24];
  undefined1 local_48 [28];
  int local_2c;
  uint local_28;
  int local_24;
  int *local_20;
  int *local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_2c = 0xb;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  cfd::core::ConfidentialTransaction::GetTxOutList();
  cfd::core::ConfidentialTransaction::GetTxInList();
  local_70 = 0;
  local_78 = local_60;
  local_80._M_current =
       (ConfidentialTxInReference *)
       std::
       vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
       ::begin(in_stack_fffffffffffffee8);
  local_88 = (ConfidentialTxInReference *)
             std::
             vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
             ::end((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                    *)in_stack_fffffffffffffee8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                             *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (__normal_iterator<cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                             *)in_stack_fffffffffffffee8), bVar1) {
    local_90 = __gnu_cxx::
               __normal_iterator<cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
               ::operator*(&local_80);
    core::ConfidentialTxInReference::GetAssetEntropy(in_stack_fffffffffffffee8);
    in_stack_ffffffffffffff07 = cfd::core::ByteData256::IsEmpty();
    in_stack_ffffffffffffff06 = in_stack_ffffffffffffff07 ^ 0xff;
    core::ByteData256::~ByteData256((ByteData256 *)0x410be8);
    if ((in_stack_ffffffffffffff06 & 1) != 0) {
      local_70 = local_70 + 1;
      core::ConfidentialTxInReference::GetBlindingNonce(in_stack_fffffffffffffee8);
      in_stack_ffffffffffffff05 = cfd::core::ByteData256::IsEmpty();
      in_stack_ffffffffffffff04 = in_stack_ffffffffffffff05 ^ 0xff;
      core::ByteData256::~ByteData256((ByteData256 *)0x410c3d);
      if ((in_stack_ffffffffffffff04 & 1) == 0) {
        local_70 = local_70 + 1;
      }
    }
    local_70 = local_70 + 1;
    __gnu_cxx::
    __normal_iterator<cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
    ::operator++(&local_80);
  }
  local_c4 = 0;
  local_c8 = 0;
  local_cc = 0;
  local_d0 = 0;
  local_d8 = local_48;
  local_e0._M_current =
       (ConfidentialTxOutReference *)
       std::
       vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
       ::begin((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                *)in_stack_fffffffffffffee8);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::end((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
         *)in_stack_fffffffffffffee8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<cfd::core::ConfidentialTxOutReference_*,_std::vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>_>
                             *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (__normal_iterator<cfd::core::ConfidentialTxOutReference_*,_std::vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>_>
                             *)in_stack_fffffffffffffee8), bVar1) {
    pCVar3 = __gnu_cxx::
             __normal_iterator<cfd::core::ConfidentialTxOutReference_*,_std::vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>_>
             ::operator*(&local_e0);
    in_stack_fffffffffffffee8 = (ConfidentialTxInReference *)0x0;
    in_stack_fffffffffffffef0 = local_70;
    cfd::core::ConfidentialTxOutReference::GetSerializeSize
              (SUB81(pCVar3,0),(uint *)(ulong)(local_9 & 1),&local_cc,(int)&local_d0,local_24,
               (uint *)(ulong)local_28,0);
    local_c4 = local_cc + local_c4;
    local_c8 = local_d0 + local_c8;
    __gnu_cxx::
    __normal_iterator<cfd::core::ConfidentialTxOutReference_*,_std::vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>_>
    ::operator++(&local_e0);
  }
  local_2c = local_c8 + local_2c;
  if (local_18 != (int *)0x0) {
    *local_18 = local_c4 + *local_18;
  }
  if (local_20 != (int *)0x0) {
    *local_20 = local_2c + *local_20;
  }
  uVar2 = local_2c + local_c4;
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
             *)CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,
                                 CONCAT15(in_stack_ffffffffffffff05,
                                          CONCAT14(in_stack_ffffffffffffff04,uVar2)))));
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             *)CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,
                                 CONCAT15(in_stack_ffffffffffffff05,
                                          CONCAT14(in_stack_ffffffffffffff04,uVar2)))));
  return uVar2;
}

Assistant:

uint32_t ConfidentialTransactionController::GetSizeIgnoreTxIn(
    bool is_blinded, uint32_t* witness_area_size,
    uint32_t* no_witness_area_size, int exponent, int minimum_bits) const {
  uint32_t size = ConfidentialTransaction::kElementsTransactionMinimumSize;
  std::vector<ConfidentialTxOutReference> txouts = transaction_.GetTxOutList();
  std::vector<ConfidentialTxInReference> txins = transaction_.GetTxInList();

  uint32_t temp_asset_count = 0;

  // search vin from issue/reissue
  for (const auto& txin : txins) {
    if (!txin.GetAssetEntropy().IsEmpty()) {
      ++temp_asset_count;
      if (!txin.GetBlindingNonce().IsEmpty()) {
        // reissuance
      } else {
        ++temp_asset_count;  // issuance
      }
    }
    ++temp_asset_count;
  }

  uint32_t witness_size = 0;
  uint32_t no_witness_size = 0;
  uint32_t temp_witness_size = 0;
  uint32_t temp_no_witness_size = 0;
  for (const auto& txout : txouts) {
    txout.GetSerializeSize(
        is_blinded, &temp_witness_size, &temp_no_witness_size, exponent,
        minimum_bits, nullptr, temp_asset_count);
    witness_size += temp_witness_size;
    no_witness_size += temp_no_witness_size;
  }
  size += no_witness_size;

  if (witness_area_size != nullptr) {
    *witness_area_size += witness_size;
  }
  if (no_witness_area_size != nullptr) {
    *no_witness_area_size += size;
  }
  return size + witness_size;
}